

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O1

stream * copy_stream(stream *s)

{
  long lVar1;
  stream *psVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = init_stream((uint16_t)s->size);
  memcpy(psVar2->stream,s->stream,s->size);
  psVar2->w_head = s->w_head;
  psVar2->r_head = s->r_head;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psVar2;
  }
  __stack_chk_fail();
}

Assistant:

struct stream *copy_stream(struct stream *s)
{
	struct stream *cpy = init_stream(s->size);

	memcpy(cpy->stream, s->stream, s->size);
	cpy->w_head = s->w_head;
	cpy->r_head = s->r_head;
	return cpy;
}